

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O0

SUNErrCode SUNDataNode_Destroy_InMem(SUNDataNode *node)

{
  SUNStlVector_SUNDataNode *in_RDI;
  SUNHashMap map;
  void *queue;
  SUNContext_conflict sunctx_local_scope_;
  SUNHashMap *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  if ((int)(*in_RDI)->capacity == 2) {
    SUNHashMap_Destroy(in_stack_ffffffffffffffd8);
  }
  else if ((int)(*in_RDI)->capacity == 1) {
    SUNStlVector_SUNDataNode_Destroy(in_RDI);
  }
  else if (((int)(*in_RDI)->capacity == 0) && ((*in_RDI)->values[2] != (SUNDataNode)0x0)) {
    SUNMemoryHelper_Dealloc
              ((SUNMemoryHelper)(*in_RDI)->destroyValue,(SUNMemory)0x0,in_stack_ffffffffffffffe0);
  }
  sunDataNode_DestroyCommon_InMem((SUNDataNode *)0x1088d2);
  *in_RDI = (SUNStlVector_SUNDataNode)0x0;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_Destroy_InMem(SUNDataNode* node)
{
  SUNFunctionBegin((*node)->sunctx);

  /* Use the default queue for the memory helper */
  void* queue = NULL;

  if (BASE_MEMBER(*node, dtype) == SUNDATANODE_OBJECT)
  {
    SUNHashMap map = IMPL_MEMBER(*node, named_children);
    SUNHashMap_Destroy(&map);
  }
  else if (BASE_MEMBER(*node, dtype) == SUNDATANODE_LIST)
  {
    SUNStlVector_SUNDataNode_Destroy(&IMPL_MEMBER(*node, anon_children));
  }
  else if (BASE_MEMBER(*node, dtype) == SUNDATANODE_LEAF)
  {
    if (IMPL_MEMBER(*node, leaf_data))
    {
      SUNCheckCall(SUNMemoryHelper_Dealloc(IMPL_MEMBER(*node, mem_helper),
                                           IMPL_MEMBER(*node, leaf_data), queue));
    }
  }

  sunDataNode_DestroyCommon_InMem(node);
  *node = NULL;

  return SUN_SUCCESS;
}